

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

CopyResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopySuffix(CordRepBtree *this,size_t offset)

{
  int *piVar1;
  RefcountAndFlags *pRVar2;
  CordRep **ppCVar3;
  byte bVar4;
  CordRepBtree *pCVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  CordRepBtree *pCVar13;
  CordRepBtree *pCVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  size_t offset_00;
  long lVar20;
  size_t sVar21;
  size_t sVar22;
  CopyResult CVar23;
  
  uVar15 = (this->super_CordRep).length;
  uVar19 = uVar15 - offset;
  if (uVar15 < offset || uVar19 == 0) {
    __assert_fail("offset < this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,700,"CopyResult absl::cord_internal::CordRepBtree::CopySuffix(size_t)");
  }
  uVar17 = (uint)(this->super_CordRep).storage[0];
  uVar12 = (ulong)(this->super_CordRep).storage[2];
  pCVar5 = *(CordRepBtree **)((this->super_CordRep).storage + uVar12 * 8 + -5);
  uVar15 = (pCVar5->super_CordRep).length;
  if (uVar19 <= uVar15) {
    do {
      uVar16 = uVar15;
      this = pCVar5;
      if ((int)uVar17 < 1) {
        LOCK();
        pRVar2 = &(this->super_CordRep).refcount;
        (pRVar2->count_).super___atomic_base<int>._M_i =
             (pRVar2->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        uVar17 = 0xffffffff;
        sVar22 = uVar16 - uVar19;
        if (sVar22 != 0) {
          this = (CordRepBtree *)anon_unknown_0::CreateSubstring(&this->super_CordRep,sVar22,uVar19)
          ;
        }
        goto LAB_002b1145;
      }
      if ((this->super_CordRep).tag != '\x03') goto LAB_002b1178;
      uVar12 = (ulong)(this->super_CordRep).storage[2];
      pCVar5 = *(CordRepBtree **)((this->super_CordRep).storage + uVar12 * 8 + -5);
      uVar15 = (pCVar5->super_CordRep).length;
      uVar17 = uVar17 - 1;
    } while (uVar19 <= uVar15);
    offset = uVar16 - uVar19;
  }
  if (offset == 0) {
    LOCK();
    pRVar2 = &(this->super_CordRep).refcount;
    (pRVar2->count_).super___atomic_base<int>._M_i =
         (pRVar2->count_).super___atomic_base<int>._M_i + 2;
    UNLOCK();
  }
  else {
    bVar4 = (this->super_CordRep).storage[1];
    uVar16 = (ulong)bVar4;
    lVar18 = (ulong)bVar4 << 3;
    lVar20 = 0;
    uVar15 = 0;
    do {
      uVar15 = uVar15 + **(long **)((long)this->edges_ + lVar18);
      lVar18 = lVar18 + 8;
      lVar20 = lVar20 + -1;
      sVar22 = uVar15 - offset;
    } while (uVar15 < offset);
    uVar15 = uVar16 - lVar20;
    if (uVar15 < uVar16) {
LAB_002b1213:
      __assert_fail("begin >= this->begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2c1,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyToEndFrom(size_t, size_t) const"
                   );
    }
    if (uVar12 < uVar15) {
LAB_002b1197:
      __assert_fail("begin <= this->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2c2,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyToEndFrom(size_t, size_t) const"
                   );
    }
    pCVar13 = (CordRepBtree *)operator_new(0x40);
    (pCVar13->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (pCVar13->super_CordRep).length = uVar19;
    uVar6 = *(undefined8 *)((long)this->edges_ + 4);
    uVar7 = *(undefined8 *)((long)this->edges_ + 0xc);
    uVar8 = *(undefined8 *)((long)this->edges_ + 0x14);
    uVar9 = *(undefined8 *)((long)this->edges_ + 0x1c);
    uVar10 = *(undefined8 *)((long)this->edges_ + 0x24);
    *(undefined8 *)&(pCVar13->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
    *(undefined8 *)((long)pCVar13->edges_ + 4) = uVar6;
    *(undefined8 *)((long)pCVar13->edges_ + 0xc) = uVar7;
    *(undefined8 *)((long)pCVar13->edges_ + 0x14) = uVar8;
    *(undefined8 *)((long)pCVar13->edges_ + 0x1c) = uVar9;
    *(undefined8 *)((long)pCVar13->edges_ + 0x24) = uVar10;
    *(undefined4 *)((long)pCVar13->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
    uVar19 = uVar16 - lVar20;
    (pCVar13->super_CordRep).storage[1] = (uint8_t)uVar19;
    bVar4 = (pCVar13->super_CordRep).storage[2];
    pCVar5 = pCVar13;
    uVar11 = uVar17;
    if (uVar16 - bVar4 != lVar20) {
      do {
        lVar20 = *(long *)((long)pCVar13->edges_ + lVar18);
        if (lVar20 == 0) {
LAB_002b1159:
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        piVar1 = (int *)(lVar20 + 8);
        *piVar1 = *piVar1 + 2;
        UNLOCK();
        lVar18 = lVar18 + 8;
      } while ((ulong)bVar4 * 8 != lVar18);
    }
    while (sVar22 != 0) {
      if (uVar15 == 0) {
        __assert_fail("pos.index >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x2de,"CopyResult absl::cord_internal::CordRepBtree::CopySuffix(size_t)");
      }
      uVar19 = uVar15 - 1;
      (pCVar5->super_CordRep).storage[1] = (uint8_t)uVar19;
      if (uVar19 < (this->super_CordRep).storage[1]) {
        __assert_fail("index >= begin()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      if ((this->super_CordRep).storage[2] <= uVar19) {
        __assert_fail("index < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      this = *(CordRepBtree **)((this->super_CordRep).storage + uVar15 * 8 + -5);
      sVar21 = (this->super_CordRep).length;
      offset_00 = sVar21 - sVar22;
      if ((int)uVar11 < 1) {
        LOCK();
        pRVar2 = &(this->super_CordRep).refcount;
        (pRVar2->count_).super___atomic_base<int>._M_i =
             (pRVar2->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        if (sVar21 != sVar22) {
          this = (CordRepBtree *)
                 anon_unknown_0::CreateSubstring(&this->super_CordRep,offset_00,sVar22);
        }
        *(CordRepBtree **)((pCVar5->super_CordRep).storage + uVar15 * 8 + -5) = this;
        this = pCVar13;
        goto LAB_002b1145;
      }
      if ((this->super_CordRep).tag != '\x03') {
LAB_002b1178:
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      uVar12 = (ulong)(this->super_CordRep).storage[1];
      uVar19 = uVar12;
      if (sVar21 == sVar22) {
        sVar21 = 0;
      }
      else {
        uVar16 = 0;
        do {
          ppCVar3 = this->edges_ + uVar19;
          uVar19 = uVar19 + 1;
          uVar16 = uVar16 + (*ppCVar3)->length;
          sVar21 = uVar16 - offset_00;
        } while (uVar16 < offset_00);
        if (uVar19 < uVar12) goto LAB_002b1213;
      }
      if ((this->super_CordRep).storage[2] < uVar19) goto LAB_002b1197;
      pCVar14 = (CordRepBtree *)operator_new(0x40);
      (pCVar14->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
      (pCVar14->super_CordRep).length = sVar22;
      uVar6 = *(undefined8 *)((long)this->edges_ + 4);
      uVar7 = *(undefined8 *)((long)this->edges_ + 0xc);
      uVar8 = *(undefined8 *)((long)this->edges_ + 0x14);
      uVar9 = *(undefined8 *)((long)this->edges_ + 0x1c);
      uVar10 = *(undefined8 *)((long)this->edges_ + 0x24);
      *(undefined8 *)&(pCVar14->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
      *(undefined8 *)((long)pCVar14->edges_ + 4) = uVar6;
      *(undefined8 *)((long)pCVar14->edges_ + 0xc) = uVar7;
      *(undefined8 *)((long)pCVar14->edges_ + 0x14) = uVar8;
      *(undefined8 *)((long)pCVar14->edges_ + 0x1c) = uVar9;
      *(undefined8 *)((long)pCVar14->edges_ + 0x24) = uVar10;
      *(undefined4 *)((long)pCVar14->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
      (pCVar14->super_CordRep).storage[1] = (uint8_t)uVar19;
      bVar4 = (pCVar14->super_CordRep).storage[2];
      if (uVar19 != bVar4) {
        lVar18 = uVar19 * 8;
        do {
          lVar20 = *(long *)((long)pCVar14->edges_ + lVar18);
          if (lVar20 == 0) goto LAB_002b1159;
          LOCK();
          piVar1 = (int *)(lVar20 + 8);
          *piVar1 = *piVar1 + 2;
          UNLOCK();
          lVar18 = lVar18 + 8;
        } while ((ulong)bVar4 * 8 != lVar18);
      }
      *(CordRepBtree **)((pCVar5->super_CordRep).storage + uVar15 * 8 + -5) = pCVar14;
      sVar22 = sVar21;
      uVar15 = uVar19;
      pCVar5 = pCVar14;
      uVar11 = uVar11 - 1;
    }
    (pCVar5->super_CordRep).storage[1] = (uint8_t)uVar19;
    this = pCVar13;
  }
LAB_002b1145:
  CVar23.height = uVar17;
  CVar23.edge = &this->super_CordRep;
  CVar23._12_4_ = 0;
  return CVar23;
}

Assistant:

CopyResult CordRepBtree::CopySuffix(size_t offset) {
  assert(offset < this->length);

  // As long as `offset` starts inside the last edge, we can 'drop' the current
  // depth. For the most extreme example: if offset references the last data
  // edge in the tree, there is only a single edge / path from the top of the
  // tree to that last edge, so we can drop all the nodes except that edge.
  // The fast path check for this is `back->length >= length - offset`.
  int height = this->height();
  CordRepBtree* node = this;
  size_t len = node->length - offset;
  CordRep* back = node->Edge(kBack);
  while (back->length >= len) {
    offset = back->length - len;
    if (--height < 0) {
      return {MakeSubstring(CordRep::Ref(back), offset), height};
    }
    node = back->btree();
    back = node->Edge(kBack);
  }
  if (offset == 0) return {CordRep::Ref(node), height};

  // Offset does not point into the last edge, so we span at least two edges.
  // Find the index of offset with `IndexBeyond` which provides us the edge
  // 'beyond' the offset if offset is not a clean starting point of an edge.
  Position pos = node->IndexBeyond(offset);
  CordRepBtree* sub = node->CopyToEndFrom(pos.index, len);
  const CopyResult result = {sub, height};

  // `pos.n` contains a non zero value if the offset is not an exact starting
  // point of an edge. In this case, `pos.n` contains the 'trailing' amount of
  // bytes of the edge preceding that in `pos.index`. We need to iteratively
  // adjust the preceding edge with the 'broken' offset until we have a perfect
  // start of the edge.
  while (pos.n != 0) {
    assert(pos.index >= 1);
    const size_t begin = pos.index - 1;
    sub->set_begin(begin);
    CordRep* const edge = node->Edge(begin);

    len = pos.n;
    offset = edge->length - len;

    if (--height < 0) {
      sub->edges_[begin] = MakeSubstring(CordRep::Ref(edge), offset, len);
      return result;
    }

    node = edge->btree();
    pos = node->IndexBeyond(offset);

    CordRepBtree* nsub = node->CopyToEndFrom(pos.index, len);
    sub->edges_[begin] = nsub;
    sub = nsub;
  }
  sub->set_begin(pos.index);
  return result;
}